

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

sync_schema_result __thiscall
sqlite_orm::internal::storage_impl<$a9b60b26$>::schema_status
          (storage_impl<_a9b60b26_> *this,sqlite3 *db,bool preserve)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  reference pptVar4;
  ulong uVar5;
  undefined1 in_DL;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *in_RSI;
  sqlite3 *in_RDI;
  string *unaff_retaddr;
  storage_impl_base *in_stack_00000008;
  table_info *columnPointer;
  iterator __end6;
  iterator __begin6;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *__range6;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> columnsToAdd;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> dbTableInfo;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> storageTableInfo;
  bool gottaCreateTable;
  sync_schema_result res;
  sqlite3 *in_stack_00000170;
  string *in_stack_00000178;
  storage_impl_base *in_stack_00000180;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *this_00;
  undefined7 in_stack_ffffffffffffff50;
  __normal_iterator<sqlite_orm::table_info_**,_std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>_>
  local_88;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *local_80;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> local_78;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> local_50 [2];
  byte local_19;
  sync_schema_result sVar6;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar7;
  sqlite3 *db_00;
  
  uVar7 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  sVar6 = already_in_sync;
  db_00 = in_RDI;
  bVar1 = storage_impl_base::table_exists(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  local_19 = (bVar1 ^ 0xffU) & 1;
  if (local_19 == 0) {
    table_t<$fff27d53$>::get_table_info((table_t<_fff27d53_> *)CONCAT44(uVar7,sVar6));
    storage_impl_base::get_table_info(in_stack_00000008,unaff_retaddr,db_00);
    this_00 = &local_78;
    std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>::vector
              ((vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *)
               0x264cd4);
    uVar2 = storage_impl_base::get_remove_add_columns
                      ((vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
                        *)unaff_retaddr,
                       (vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)
                       db_00,in_RSI);
    if ((bool)uVar2) {
      local_19 = 1;
    }
    if (((local_19 & 1) == 0) &&
       (sVar3 = std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::size
                          (local_50), sVar3 != 0)) {
      if ((uVar7 & 0x1000000) == 0) {
        local_19 = 1;
      }
      else {
        sVar6 = old_columns_removed;
      }
    }
    if ((local_19 & 1) == 0) {
      sVar3 = std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>::size
                        (&local_78);
      if (sVar3 == 0) {
        if (sVar6 != old_columns_removed) {
          sVar6 = already_in_sync;
        }
      }
      else {
        local_80 = &local_78;
        local_88._M_current =
             (table_info **)
             std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>::begin
                       (this_00);
        std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>::end
                  (this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<sqlite_orm::table_info_**,_std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>_>
                                   *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                                  (__normal_iterator<sqlite_orm::table_info_**,_std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>_>
                                   *)this_00), bVar1) {
          pptVar4 = __gnu_cxx::
                    __normal_iterator<sqlite_orm::table_info_**,_std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>_>
                    ::operator*(&local_88);
          if ((((*pptVar4)->notnull & 1U) != 0) &&
             (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
            local_19 = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<sqlite_orm::table_info_**,_std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>_>
          ::operator++(&local_88);
        }
        if ((local_19 & 1) == 0) {
          if (sVar6 == old_columns_removed) {
            sVar6 = new_columns_added_and_old_columns_removed;
          }
          else {
            sVar6 = new_columns_added;
          }
        }
        else {
          sVar6 = dropped_and_recreated;
        }
      }
    }
    else {
      sVar6 = dropped_and_recreated;
    }
    std::vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>::~vector
              ((vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> *)in_RDI
              );
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::~vector
              ((vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)in_RDI);
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::~vector
              ((vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> *)in_RDI);
  }
  else {
    sVar6 = new_table_created;
  }
  return sVar6;
}

Assistant:

sync_schema_result schema_status(sqlite3 *db, bool preserve) const {

        auto res = sync_schema_result::already_in_sync;

        //  first let's see if table with such name exists..
        auto gottaCreateTable = !this->table_exists(this->table.name, db);
        if(!gottaCreateTable) {

            //  get table info provided in `make_table` call..
            auto storageTableInfo = this->table.get_table_info();

            //  now get current table info from db using `PRAGMA table_info` query..
            auto dbTableInfo = this->get_table_info(this->table.name, db);

            //  this vector will contain pointers to columns that gotta be added..
            std::vector<table_info *> columnsToAdd;

            if(this->get_remove_add_columns(columnsToAdd, storageTableInfo, dbTableInfo)) {
                gottaCreateTable = true;
            }

            if(!gottaCreateTable) {  //  if all storage columns are equal to actual db columns but there are
                //  excess columns at the db..
                if(dbTableInfo.size() > 0) {
                    // extra table columns than storage columns
                    if(!preserve) {
                        gottaCreateTable = true;
                    } else {
                        res = decltype(res)::old_columns_removed;
                    }
                }
            }
            if(gottaCreateTable) {
                res = decltype(res)::dropped_and_recreated;
            } else {
                if(columnsToAdd.size()) {
                    // extra storage columns than table columns
                    for(auto columnPointer: columnsToAdd) {
                        if(columnPointer->notnull && columnPointer->dflt_value.empty()) {
                            gottaCreateTable = true;
                            break;
                        }
                    }
                    if(!gottaCreateTable) {
                        if(res == decltype(res)::old_columns_removed) {
                            res = decltype(res)::new_columns_added_and_old_columns_removed;
                        } else {
                            res = decltype(res)::new_columns_added;
                        }
                    } else {
                        res = decltype(res)::dropped_and_recreated;
                    }
                } else {
                    if(res != decltype(res)::old_columns_removed) {
                        res = decltype(res)::already_in_sync;
                    }
                }
            }
        } else {
            res = decltype(res)::new_table_created;
        }
        return res;
    }